

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O2

void __thiscall Face::build_map(Face *this,Corner reference_corner,Eq_Pos_Table *eq_pos_table)

{
  long lVar1;
  Color *pCVar2;
  long lVar3;
  long lVar4;
  int i;
  ulong uVar5;
  long local_98;
  pair<Position,_Color_*> local_90;
  Color *local_78;
  Face *local_70;
  Eq_Pos_Table *local_68;
  long local_60;
  long local_58;
  long local_50;
  vector<Position,_std::allocator<Position>_> eq_positions;
  
  local_78 = this->color_data;
  local_98 = 1;
  local_70 = this;
  local_68 = eq_pos_table;
  for (local_60 = 0; local_60 != 4; local_60 = local_60 + 1) {
    local_58 = local_60 * local_60;
    lVar4 = 0;
    while (lVar3 = local_60, lVar4 != local_98) {
      lVar1 = lVar4 + local_58;
      Eq_Pos_Table::get_equivalent_positions
                (&eq_positions,local_68,local_70->center_color,(int)lVar1);
      pCVar2 = local_78 + lVar1;
      local_90.first.layer = (int)lVar3;
      local_90.first.reference_corner = reference_corner;
      local_90.first.entry = (int)lVar4;
      local_90.second = pCVar2;
      local_50 = lVar4;
      std::
      _Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
      ::_M_emplace_unique<std::pair<Position,Color*>>
                ((_Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
                  *)&this->current_state,&local_90);
      lVar4 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)(((long)eq_positions.
                                 super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)eq_positions.super__Vector_base<Position,_std::allocator<Position>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar5 = uVar5 + 1
          ) {
        local_90.first.entry =
             *(int *)((long)&(eq_positions.super__Vector_base<Position,_std::allocator<Position>_>.
                              _M_impl.super__Vector_impl_data._M_start)->entry + lVar4);
        local_90.first._0_8_ =
             *(undefined8 *)
              ((long)&(eq_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                       super__Vector_impl_data._M_start)->reference_corner + lVar4);
        local_90.second = pCVar2;
        std::
        _Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
        ::_M_emplace_unique<std::pair<Position,Color*>>
                  ((_Rb_tree<Position,std::pair<Position_const,Color*>,std::_Select1st<std::pair<Position_const,Color*>>,std::less<Position>,std::allocator<std::pair<Position_const,Color*>>>
                    *)&this->current_state,&local_90);
        lVar4 = lVar4 + 0xc;
      }
      std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
                (&eq_positions.super__Vector_base<Position,_std::allocator<Position>_>);
      lVar4 = local_50 + 1;
    }
    local_98 = local_98 + 2;
  }
  return;
}

Assistant:

void Face::build_map(Corner reference_corner, Eq_Pos_Table& eq_pos_table){
    Position current_position;
    current_position.reference_corner = reference_corner;
    for(int layer = 0; layer < 4; layer++){
        current_position.layer = layer;
        for(int entry = 0; entry < (2*layer + 1); entry++){
            current_position.entry = entry;
            int flat_entry = (layer*layer) + entry;
            std::vector<Position> eq_positions = eq_pos_table.get_equivalent_positions(center_color, flat_entry);
            current_state.insert(std::pair<Position, Color*>(current_position, &color_data[flat_entry]));
            for(int i = 0; i < eq_positions.size(); i++){
                current_state.insert(std::pair<Position, Color*>(eq_positions[i], &color_data[flat_entry]));
            }
        }
    }
}